

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6_zigzagConversion.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  string local_88;
  string local_68;
  int local_48;
  int numRows;
  allocator<char> local_31;
  string local_30 [8];
  string s;
  
  s.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"AB",&local_31);
  std::allocator<char>::~allocator(&local_31);
  local_48 = 1;
  std::__cxx11::string::string((string *)&local_88,local_30);
  convert(&local_68,&local_88,local_48);
  this = std::operator<<((ostream *)&std::cout,(string *)&local_68);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  s.field_2._12_4_ = 0;
  std::__cxx11::string::~string(local_30);
  return s.field_2._12_4_;
}

Assistant:

int main()
{
	// string s = "PAYPALISHIRING";
	string s="AB";
	int numRows = 1;
	cout<<convert(s,numRows)<<endl;
	return 0;
}